

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::OneHotEncoder::MergeFrom(OneHotEncoder *this,OneHotEncoder *from)

{
  void *pvVar1;
  LogMessage *other;
  StringVector *this_00;
  StringVector *from_00;
  Int64Vector *this_01;
  Int64Vector *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/OneHotEncoder.pb.cc"
               ,0x16d);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->outputsparse_ == true) {
    this->outputsparse_ = true;
  }
  if (from->handleunknown_ != 0) {
    this->handleunknown_ = from->handleunknown_;
  }
  if (from->_oneof_case_[0] == 2) {
    this_01 = mutable_int64categories(this);
    from_01 = int64categories(from);
    Int64Vector::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 1) {
    this_00 = mutable_stringcategories(this);
    from_00 = stringcategories(from);
    StringVector::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void OneHotEncoder::MergeFrom(const OneHotEncoder& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.OneHotEncoder)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.outputsparse() != 0) {
    set_outputsparse(from.outputsparse());
  }
  if (from.handleunknown() != 0) {
    set_handleunknown(from.handleunknown());
  }
  switch (from.CategoryType_case()) {
    case kStringCategories: {
      mutable_stringcategories()->::CoreML::Specification::StringVector::MergeFrom(from.stringcategories());
      break;
    }
    case kInt64Categories: {
      mutable_int64categories()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64categories());
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
}